

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::PrintFileRuntimePreamble
          (FileGenerator *this,Printer *printer,string *header_to_import)

{
  string cpp_symbol;
  string framework_name;
  
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                     ,"filename",*(string **)this->file_);
  std::__cxx11::string::string((string *)&framework_name,"Protobuf",(allocator *)&cpp_symbol);
  ProtobufFrameworkImportSymbol(&cpp_symbol,&framework_name);
  io::Printer::Print(printer,
                     "// This CPP symbol can be defined to use imports that match up to the framework\n// imports needed when using CocoaPods.\n#if !defined($cpp_symbol$)\n #define $cpp_symbol$ 0\n#endif\n\n#if $cpp_symbol$\n #import <$framework_name$/$header$>\n#else\n #import \"$header$\"\n#endif\n\n"
                     ,"cpp_symbol",&cpp_symbol,"header",header_to_import,"framework_name",
                     &framework_name);
  std::__cxx11::string::~string((string *)&cpp_symbol);
  std::__cxx11::string::~string((string *)&framework_name);
  return;
}

Assistant:

void FileGenerator::PrintFileRuntimePreamble(
    io::Printer* printer, const string& header_to_import) const {
  printer->Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// source: $filename$\n"
      "\n",
      "filename", file_->name());

  const string framework_name(ProtobufLibraryFrameworkName);
  const string cpp_symbol(ProtobufFrameworkImportSymbol(framework_name));
  printer->Print(
      "// This CPP symbol can be defined to use imports that match up to the framework\n"
      "// imports needed when using CocoaPods.\n"
      "#if !defined($cpp_symbol$)\n"
      " #define $cpp_symbol$ 0\n"
      "#endif\n"
      "\n"
      "#if $cpp_symbol$\n"
      " #import <$framework_name$/$header$>\n"
      "#else\n"
      " #import \"$header$\"\n"
      "#endif\n"
      "\n",
      "cpp_symbol", cpp_symbol,
      "header", header_to_import,
      "framework_name", framework_name);
}